

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

QpVector * __thiscall MatrixBase::extractcol(MatrixBase *this,HighsInt col,QpVector *target)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  QpVector::reset(target);
  if (col < this->num_col) {
    piVar2 = (this->start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = piVar2[col];
    for (lVar7 = 0; lVar9 = (long)piVar2[(long)col + 1] - (long)iVar8, lVar7 < lVar9;
        lVar7 = lVar7 + 1) {
      iVar1 = piVar3[iVar8 + (int)lVar7];
      piVar4[lVar7] = iVar1;
      iVar8 = piVar2[col];
      pdVar5[iVar1] = pdVar6[(int)lVar7 + iVar8];
    }
  }
  else {
    *(target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = col - this->num_col;
    (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(long)col - (long)this->num_col] = 1.0;
    lVar9 = 1;
  }
  target->num_nz = (HighsInt)lVar9;
  return target;
}

Assistant:

QpVector& extractcol(HighsInt col, QpVector& target) const {
    assert(target.dim == num_row);
    target.reset();

    if (col >= num_col) {
      target.index[0] = col - num_col;
      target.value[col - num_col] = 1.0;
      target.num_nz = 1;
    } else {
      for (HighsInt i = 0; i < start[col + 1] - start[col]; i++) {
        target.index[i] = index[start[col] + i];
        target.value[target.index[i]] = value[start[col] + i];
      }
      target.num_nz = start[col + 1] - start[col];
    }

    return target;
  }